

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

int __thiscall ADPlanner::set_goal(ADPlanner *this,int goal_stateID)

{
  int iVar1;
  undefined4 in_ESI;
  long *in_RDI;
  
  (**(code **)(*(long *)in_RDI[1] + 0x90))((long *)in_RDI[1],in_ESI,1,_stdout);
  if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
    iVar1 = (**(code **)(*in_RDI + 0x178))(in_RDI,in_ESI,in_RDI[0xf]);
    if (iVar1 != 1) {
      return 0;
    }
  }
  else {
    iVar1 = (**(code **)(*in_RDI + 0x170))(in_RDI,in_ESI,in_RDI[0xf]);
    if (iVar1 != 1) {
      return 0;
    }
  }
  return 1;
}

Assistant:

int ADPlanner::set_goal(int goal_stateID)
{
    SBPL_PRINTF("planner: setting goal to %d\n", goal_stateID);
    environment_->PrintState(goal_stateID, true, stdout);

    if (bforwardsearch) {
        if (SetSearchGoalState(goal_stateID, pSearchStateSpace_) != 1) {
            SBPL_ERROR("ERROR: failed to set search goal state\n");
            return 0;
        }
    }
    else {
        if (SetSearchStartState(goal_stateID, pSearchStateSpace_) != 1) {
            SBPL_ERROR("ERROR: failed to set search start state\n");
            return 0;
        }
    }

    return 1;
}